

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O1

uint32_t duckdb::ParquetCrypto::Read
                   (TBase *object,TProtocol *iprot,string *key,EncryptionUtil *encryption_util_p)

{
  DecryptionTransport *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  data_ptr_t pdVar1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  AllocatedData all;
  TCompactProtocolFactoryT<duckdb::SimpleReadTransport> tsimple_proto_factory;
  TCompactProtocolFactoryT<duckdb::DecryptionTransport> tproto_factory;
  shared_ptr<duckdb_apache::thrift::protocol::TProtocol> simple_prot;
  shared_ptr<duckdb_apache::thrift::protocol::TProtocol> dprot;
  AllocatedData local_98;
  shared_ptr<duckdb_apache::thrift::transport::TTransport> local_78;
  shared_ptr<duckdb_apache::thrift::transport::TTransport> local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  Allocator *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  local_68.
  super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)&PTR__TProtocolFactory_024bf978;
  local_68.
  super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_98.allocator.ptr = (Allocator *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::DecryptionTransport,std::allocator<duckdb::DecryptionTransport>,duckdb_apache::thrift::protocol::TProtocol&,std::__cxx11::string_const&,duckdb::EncryptionUtil_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98.pointer,
             (DecryptionTransport **)&local_98,(allocator<duckdb::DecryptionTransport> *)&local_78,
             iprot,key,encryption_util_p);
  local_38 = local_98.allocator.ptr;
  p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.pointer;
  local_98.allocator.ptr = (Allocator *)0x0;
  local_98.pointer = (data_ptr_t)0x0;
  duckdb_apache::thrift::protocol::TCompactProtocolFactoryT<duckdb::DecryptionTransport>::
  getProtocol((TCompactProtocolFactoryT<duckdb::DecryptionTransport> *)local_48,&local_68);
  if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.pointer !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.pointer);
  }
  this = *(DecryptionTransport **)(local_48._0_8_ + 8);
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_48._0_8_ + 0x10);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  DecryptionTransport::ReadAll(&local_98,this);
  iVar2 = (int)local_98.allocated_size;
  pdVar1 = local_98.pointer;
  local_78.
  super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)&PTR__TProtocolFactory_024bfde8;
  local_78.
  super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  local_20->_M_use_count = 1;
  local_20->_M_weak_count = 1;
  local_20->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_024c0168;
  local_28 = local_20 + 1;
  local_20[1]._vptr__Sp_counted_base = (_func_int **)&PTR__TTransport_024c01b8;
  *(data_ptr_t *)&local_20[1]._M_use_count = pdVar1;
  *(int *)&local_20[2]._vptr__Sp_counted_base = iVar2;
  *(undefined4 *)((long)&local_20[2]._vptr__Sp_counted_base + 4) = 0;
  duckdb_apache::thrift::protocol::TCompactProtocolFactoryT<duckdb::SimpleReadTransport>::
  getProtocol((TCompactProtocolFactoryT<duckdb::SimpleReadTransport> *)local_58,&local_78);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  (*object->_vptr_TBase[2])(object,local_58._0_8_);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  duckdb_apache::thrift::protocol::TProtocolFactory::~TProtocolFactory
            ((TProtocolFactory *)&local_78);
  AllocatedData::~AllocatedData(&local_98);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
  }
  duckdb_apache::thrift::protocol::TProtocolFactory::~TProtocolFactory
            ((TProtocolFactory *)&local_68);
  return (int)local_98.allocated_size + 0x20;
}

Assistant:

uint32_t ParquetCrypto::Read(TBase &object, TProtocol &iprot, const string &key,
                             const EncryptionUtil &encryption_util_p) {
	TCompactProtocolFactoryT<DecryptionTransport> tproto_factory;
	auto dprot = tproto_factory.getProtocol(std::make_shared<DecryptionTransport>(iprot, key, encryption_util_p));
	auto &dtrans = reinterpret_cast<DecryptionTransport &>(*dprot->getTransport());

	// We have to read the whole thing otherwise thrift throws an error before we realize we're decryption is wrong
	auto all = dtrans.ReadAll();
	TCompactProtocolFactoryT<SimpleReadTransport> tsimple_proto_factory;
	auto simple_prot =
	    tsimple_proto_factory.getProtocol(std::make_shared<SimpleReadTransport>(all.get(), all.GetSize()));

	// Read the object
	object.read(simple_prot.get());

	return ParquetCrypto::LENGTH_BYTES + ParquetCrypto::NONCE_BYTES + all.GetSize() + ParquetCrypto::TAG_BYTES;
}